

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O2

int thread_peak_reset_ctl
              (tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
              size_t newlen)

{
  if (((oldp == (void *)0x0 && oldlenp == (size_t *)0x0) && newp == (void *)0x0) && newlen == 0) {
    duckdb_je_peak_event_zero(tsd);
  }
  return (uint)(((oldp != (void *)0x0 || oldlenp != (size_t *)0x0) || newp != (void *)0x0) ||
               newlen != 0);
}

Assistant:

static int
thread_peak_reset_ctl(tsd_t *tsd, const size_t *mib,
    size_t miblen, void *oldp, size_t *oldlenp, void *newp,
    size_t newlen) {
	int ret;
	if (!config_stats) {
		return ENOENT;
	}
	NEITHER_READ_NOR_WRITE();
	peak_event_zero(tsd);
	ret = 0;
label_return:
	return ret;
}